

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::SetMotorVoltageRatio(AmpIO *this,uint index,double ratio)

{
  uint32_t uVar1;
  uint uVar2;
  double ratio_local;
  uint index_local;
  AmpIO *this_local;
  
  uVar1 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar1 == 0x64524131) {
    if (index < this->NumMotors) {
      if (((this->collect_state & 1U) != 0) && ((uint)this->collect_chan == index + 1)) {
        uVar2 = index + this->WB_CURR_OFFSET;
        this->WriteBuffer[uVar2] = this->WriteBuffer[uVar2] | 0x40000000;
      }
      uVar2 = index + this->WB_CURR_OFFSET;
      this->WriteBuffer[uVar2] = this->WriteBuffer[uVar2] | 0x80000000;
      uVar2 = index + this->WB_CURR_OFFSET;
      this->WriteBuffer[uVar2] = this->WriteBuffer[uVar2] & 0xf0000000;
      uVar2 = index + this->WB_CURR_OFFSET;
      this->WriteBuffer[uVar2] = this->WriteBuffer[uVar2] | 0x1000000;
      uVar2 = index + this->WB_CURR_OFFSET;
      this->WriteBuffer[uVar2] = ((int)(ratio * 1023.0) & 0x7ffU) << 0xd | this->WriteBuffer[uVar2];
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AmpIO::SetMotorVoltageRatio(unsigned int index, double ratio)
{
    if (GetHardwareVersion() != dRA1_String)
        return false;

    if (index < NumMotors) {
        if (collect_state && (collect_chan == (index+1))) {
            WriteBuffer[index+WB_CURR_OFFSET] |= COLLECT_BIT;
        }
        WriteBuffer[index+WB_CURR_OFFSET] |= VALID_BIT;
        WriteBuffer[index+WB_CURR_OFFSET] &= ~0x0FFFFFFF;
        WriteBuffer[index+WB_CURR_OFFSET] |= 1 << 24; // select voltage mode
        WriteBuffer[index+WB_CURR_OFFSET] |= ((int)(ratio * 1023) & 0b11111111111) << 13;
        return true;
    } else {
        return false;
    }
}